

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void divide_subset_split(size_t *ix_arr,int *x,size_t st,size_t end,MissingAction missing_action,
                        NewCategAction new_cat_action,bool move_new_to_left,size_t *st_NA,
                        size_t *end_NA,size_t *split_ix)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (missing_action == Fail) {
    sVar3 = st;
    if (new_cat_action != Smallest || !move_new_to_left) {
      if (st <= end) {
        do {
          if (x[ix_arr[st]] == 0) {
            sVar1 = ix_arr[sVar3];
            ix_arr[sVar3] = ix_arr[st];
            ix_arr[st] = sVar1;
            sVar3 = sVar3 + 1;
          }
          st = st + 1;
        } while (st <= end);
      }
    }
    else if (st <= end) {
      do {
        if (x[ix_arr[st]] == 0 || 1 < x[ix_arr[st]]) {
          sVar1 = ix_arr[sVar3];
          ix_arr[sVar3] = ix_arr[st];
          ix_arr[st] = sVar1;
          sVar3 = sVar3 + 1;
        }
        st = st + 1;
      } while (st <= end);
    }
    *split_ix = sVar3;
  }
  else {
    if (new_cat_action != Smallest || !move_new_to_left) {
      uVar4 = st;
      if (st <= end) {
        do {
          if (x[ix_arr[st]] == 0) {
            sVar3 = ix_arr[uVar4];
            ix_arr[uVar4] = ix_arr[st];
            ix_arr[st] = sVar3;
            uVar4 = uVar4 + 1;
          }
          st = st + 1;
        } while (st <= end);
      }
      *st_NA = uVar4;
      uVar2 = uVar4;
      for (; uVar4 <= end; uVar4 = uVar4 + 1) {
        if (x[ix_arr[uVar4]] < 0) {
          sVar3 = ix_arr[uVar2];
          ix_arr[uVar2] = ix_arr[uVar4];
          ix_arr[uVar4] = sVar3;
          uVar2 = uVar2 + 1;
        }
      }
    }
    else {
      uVar4 = st;
      if (st <= end) {
        do {
          if (x[ix_arr[st]] == 0 || 1 < x[ix_arr[st]]) {
            sVar3 = ix_arr[uVar4];
            ix_arr[uVar4] = ix_arr[st];
            ix_arr[st] = sVar3;
            uVar4 = uVar4 + 1;
          }
          st = st + 1;
        } while (st <= end);
      }
      *st_NA = uVar4;
      uVar2 = uVar4;
      for (; uVar4 <= end; uVar4 = uVar4 + 1) {
        if (x[ix_arr[uVar4]] < 0) {
          sVar3 = ix_arr[uVar2];
          ix_arr[uVar2] = ix_arr[uVar4];
          ix_arr[uVar4] = sVar3;
          uVar2 = uVar2 + 1;
        }
      }
    }
    *end_NA = uVar2;
  }
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, int x[], size_t st, size_t end,
                         MissingAction missing_action, NewCategAction new_cat_action,
                         bool move_new_to_left, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    size_t temp;

    /* if NAs are not to be bothered with, just need to do a single pass */
    if (missing_action == Fail)
    {
        /* move to the left if it's l.e. than the split point */
        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (x[ix_arr[row]] == 0 || x[ix_arr[row]] > 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                if (x[ix_arr[row]] == 0)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }
        split_ix = st;
    }

    /* otherwise, first put to the left all l.e. and not NA, then all NAs to the end of the left */
    else
    {
        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (x[ix_arr[row]] == 0 || x[ix_arr[row]] > 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
            st_NA = st;

            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
            end_NA = st;
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                if (x[ix_arr[row]] == 0)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
            st_NA = st;

            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
            end_NA = st;
        }
    }
}